

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O0

void __thiscall llama_file::impl::seek(impl *this,size_t offset,int whence)

{
  runtime_error *this_00;
  int *piVar1;
  char *pcVar2;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int ret;
  string local_38 [32];
  int local_18;
  
  local_18 = fseek((FILE *)*in_RDI,in_RSI,in_EDX);
  if (local_18 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    format_abi_cxx11_((char *)local_38,"seek error: %s",pcVar2);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void seek(size_t offset, int whence) const {
// TODO: this ifdef is never true?
#ifdef _WIN32
        int ret = _fseeki64(fp, (__int64) offset, whence);
#else
        int ret = std::fseek(fp, (long) offset, whence);
#endif
        if (ret != 0) {
            throw std::runtime_error(format("seek error: %s", strerror(errno)));
        }
    }